

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall
duckdb::CSVReaderOptions::FromNamedParameters
          (CSVReaderOptions *this,named_parameter_map_t *in,ClientContext *context,
          MultiFileOptions *file_options)

{
  bool bVar1;
  __node_base *p_Var2;
  string loption;
  MultiFileReader local_78;
  string local_50;
  
  p_Var2 = &(in->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    StringUtil::Lower(&local_50,(string *)(p_Var2 + 1));
    local_78.function_name._M_dataplus._M_p = (pointer)&local_78.function_name.field_2;
    local_78.function_name.field_2._M_allocated_capacity = 0;
    local_78.function_name.field_2._8_8_ = 0;
    local_78._vptr_MultiFileReader = (_func_int **)&PTR__MultiFileReader_027a45a8;
    local_78.function_name._M_string_length = 0;
    bVar1 = MultiFileReader::ParseOption
                      (&local_78,(string *)&local_50,(Value *)(p_Var2 + 5),file_options,context);
    MultiFileReader::~MultiFileReader(&local_78);
    if (!bVar1) {
      ParseOption(this,context,(string *)(p_Var2 + 1),(Value *)(p_Var2 + 5));
    }
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void CSVReaderOptions::FromNamedParameters(const named_parameter_map_t &in, ClientContext &context,
                                           MultiFileOptions &file_options) {
	for (auto &kv : in) {
		auto loption = StringUtil::Lower(kv.first);
		if (MultiFileReader().ParseOption(loption, kv.second, file_options, context)) {
			continue;
		}
		ParseOption(context, kv.first, kv.second);
	}
}